

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O2

void __thiscall
QRhiGles2::gatherSamplers
          (QRhiGles2 *this,GLuint program,InOutVariable *v,QGles2SamplerDescriptionVector *dst)

{
  char *pcVar1;
  long in_FS_OFFSET;
  QGles2SamplerDescription local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = (v->name).d.ptr;
  if (pcVar1 == (char *)0x0) {
    pcVar1 = (char *)&QByteArray::_empty;
  }
  local_28.glslLocation =
       (*(((this->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).functions
         [0x5e])(program,pcVar1);
  if (-1 < local_28.glslLocation) {
    local_28.combinedBinding = v->binding;
    local_28.tbinding = -1;
    local_28.sbinding = -1;
    QVarLengthArray<QGles2SamplerDescription,_4LL>::append(dst,&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRhiGles2::gatherSamplers(GLuint program,
                               const QShaderDescription::InOutVariable &v,
                               QGles2SamplerDescriptionVector *dst)
{
    QGles2SamplerDescription sampler;
    sampler.glslLocation = f->glGetUniformLocation(program, v.name.constData());
    if (sampler.glslLocation >= 0) {
        sampler.combinedBinding = v.binding;
        sampler.tbinding = -1;
        sampler.sbinding = -1;
        dst->append(sampler);
    }
}